

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

Id dxil_spv::emit_atomic_access_chain
             (Impl *impl,ResourceMeta *meta,RawWidth width,Id image_id,Id coord,
             ComponentType *component_type)

{
  ComponentType CVar1;
  byte bVar2;
  Id IVar3;
  Id IVar4;
  Builder *this;
  Operation *this_00;
  Operation *this_01;
  byte bVar5;
  PhysicalPointerMeta *pPVar6;
  PhysicalPointerMeta physical_pointer_meta;
  PhysicalPointerMeta local_60;
  initializer_list<unsigned_int> local_50;
  PhysicalPointerMeta local_3c;
  
  this = Converter::Impl::builder(impl);
  bVar5 = (char)width * '\b';
  CVar1 = U32;
  if (width < Count) {
    CVar1 = (ComponentType)(0x70503ff >> (bVar5 & 0x1f));
  }
  *component_type = CVar1;
  IVar3 = get_buffer_alias_handle(impl,meta,meta->var_id,Integer,width,V1);
  if (meta->storage == StorageClassStorageBuffer) {
    bVar2 = 6;
    if (width < Count) {
      bVar2 = (char)(0x70503ff >> (bVar5 & 0x1f)) + 1;
    }
    if ((8 < bVar2) || ((0x151U >> (bVar2 & 0x1f) & 1) == 0)) goto LAB_001792fb;
    IVar4 = spv::Builder::makeIntegerType
                      (this,(&switchD_00177fab::switchdataD_001c7898)[bVar2],false);
    IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar4);
    this_01 = Converter::Impl::allocate(impl,OpAccessChain,IVar4);
    pPVar6 = &local_60;
    local_60._0_4_ = IVar3;
    IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  }
  else {
    if (meta->storage != StorageClassPhysicalStorageBuffer) {
      IVar4 = Converter::Impl::get_type_id(impl,meta->component_type,1,1,false);
      IVar4 = spv::Builder::makePointer(this,StorageClassImage,IVar4);
      this_01 = Converter::Impl::allocate(impl,OpImageTexelPointer,IVar4);
      local_60._4_4_ = coord;
      local_60._0_4_ = IVar3;
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      local_60.size = spv::Builder::makeIntConstant(this,IVar3,0,false);
      local_50._M_len = 3;
      local_50._M_array = (iterator)&local_60;
      Operation::add_ids(this_01,&local_50);
      *component_type = meta->component_type;
      goto LAB_001792da;
    }
    bVar2 = 6;
    if (width < Count) {
      bVar2 = (char)(0x70503ff >> (bVar5 & 0x1f)) + 1;
    }
    if ((8 < bVar2) || ((0x151U >> (bVar2 & 0x1f) & 1) == 0)) {
LAB_001792fb:
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    }
    IVar3 = spv::Builder::makeIntegerType
                      (this,(&switchD_00177fab::switchdataD_001c7898)[bVar2],false);
    local_60.size = (meta->physical_pointer_meta).size;
    local_60.nonwritable = (meta->physical_pointer_meta).nonwritable;
    local_60.nonreadable = (meta->physical_pointer_meta).nonreadable;
    local_60.coherent = (meta->physical_pointer_meta).coherent;
    local_60.rov = (meta->physical_pointer_meta).rov;
    local_60.stride = (meta->physical_pointer_meta).stride;
    local_60._5_3_ = *(undefined3 *)&(meta->physical_pointer_meta).field_0x5;
    bVar2 = 6;
    if (width < Count) {
      bVar2 = (char)(0x70503ff >> (bVar5 & 0x1f)) + 1;
    }
    if ((8 < bVar2) || ((0x151U >> (bVar2 & 0x1f) & 1) == 0)) goto LAB_001792fb;
    local_60.stride = (&DAT_001c78bc)[bVar2];
    IVar4 = Converter::Impl::get_physical_pointer_block_type(impl,IVar3,&local_60);
    this_00 = Converter::Impl::allocate(impl,OpBitcast,IVar4);
    Operation::add_id(this_00,image_id);
    Converter::Impl::add(impl,this_00,false);
    IVar3 = spv::Builder::makePointer(this,StorageClassPhysicalStorageBuffer,IVar3);
    this_01 = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
    local_3c._0_4_ = this_00->id;
    pPVar6 = &local_3c;
    IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  }
  IVar3 = spv::Builder::makeIntConstant(this,IVar3,0,false);
  *(Id *)&pPVar6->stride = IVar3;
  pPVar6->size = coord;
  local_50._M_len = 3;
  local_50._M_array = (iterator)pPVar6;
  Operation::add_ids(this_01,&local_50);
LAB_001792da:
  Converter::Impl::add(impl,this_01,false);
  return this_01->id;
}

Assistant:

spv::Id emit_atomic_access_chain(Converter::Impl &impl,
                                 const Converter::Impl::ResourceMeta &meta,
                                 RawWidth width, spv::Id image_id, spv::Id coord,
                                 DXIL::ComponentType &component_type)
{
	auto &builder = impl.builder();
	Operation *counter_ptr_op = nullptr;
	component_type = raw_width_to_component_type(RawType::Integer, width);
	spv::Id var_id = get_buffer_alias_handle(impl, meta, meta.var_id, RawType::Integer, width, RawVecSize::V1);
	if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		spv::Id uint_type = builder.makeUintType(raw_width_to_bits(width));
		auto physical_pointer_meta = meta.physical_pointer_meta;
		physical_pointer_meta.stride = raw_width_to_bits(width) / 8;
		spv::Id ptr_type_id =
		    impl.get_physical_pointer_block_type(uint_type, physical_pointer_meta);

		auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
		ptr_bitcast_op->add_id(image_id);
		impl.add(ptr_bitcast_op);

		counter_ptr_op = impl.allocate(spv::OpAccessChain,
		                               builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type));
		counter_ptr_op->add_ids({ ptr_bitcast_op->id, builder.makeUintConstant(0), coord });
	}
	else if (meta.storage == spv::StorageClassStorageBuffer)
	{
		counter_ptr_op =
		    impl.allocate(spv::OpAccessChain,
		                  builder.makePointer(spv::StorageClassStorageBuffer,
		                                      builder.makeUintType(raw_width_to_bits(width))));
		counter_ptr_op->add_ids({ var_id, builder.makeUintConstant(0), coord });
	}
	else
	{
		counter_ptr_op =
		    impl.allocate(spv::OpImageTexelPointer,
		                  builder.makePointer(spv::StorageClassImage, impl.get_type_id(meta.component_type, 1, 1)));
		counter_ptr_op->add_ids({ var_id, coord, builder.makeUintConstant(0) });
		component_type = meta.component_type;
	}
	impl.add(counter_ptr_op);

	return counter_ptr_op->id;
}